

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextHtmlExporter::emitFontFamily(QTextHtmlExporter *this,QStringList *families)

{
  bool bVar1;
  bool bVar2;
  QList<QString> *this_00;
  char *in_RDI;
  long in_FS_OFFSET;
  QString *family;
  QStringList *__range1;
  bool first;
  QLatin1StringView quote;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_ffffffffffffff18;
  CaseSensitivity in_stack_ffffffffffffff1c;
  QList<QString> *in_stack_ffffffffffffff20;
  QLatin1StringView in_stack_ffffffffffffff30;
  QChar local_82;
  qsizetype local_80;
  char *local_78;
  qsizetype local_58;
  char *local_50;
  QLatin1StringView local_48;
  QChar local_32;
  QLatin1StringView local_30;
  QString *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Qt::Literals::StringLiterals::operator____L1(in_RDI,(size_t)in_stack_ffffffffffffff20);
  QString::operator+=((QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      in_stack_ffffffffffffff30);
  bVar1 = true;
  local_10.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QString>::begin(in_stack_ffffffffffffff20);
  local_18.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<QString>::end(in_stack_ffffffffffffff20);
  while( true ) {
    local_20 = local_18.i;
    bVar2 = QList<QString>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar2) break;
    this_00 = (QList<QString> *)QList<QString>::const_iterator::operator*(&local_10);
    local_30.m_data = &DAT_aaaaaaaaaaaaaaaa;
    local_30.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = Qt::Literals::StringLiterals::operator____L1
                         (in_RDI,(size_t)in_stack_ffffffffffffff20);
    QChar::QChar<char16_t,_true>(&local_32,L'\'');
    bVar2 = QString::contains((QString *)this_00,(QChar)(char16_t)((ulong)in_RDI >> 0x30),
                              in_stack_ffffffffffffff1c);
    in_stack_ffffffffffffff20 = this_00;
    if (bVar2) {
      local_48 = Qt::Literals::StringLiterals::operator____L1(in_RDI,(size_t)this_00);
      in_stack_ffffffffffffff20 = this_00;
      local_30 = local_48;
    }
    if (bVar1) {
      bVar1 = false;
    }
    else {
      in_stack_ffffffffffffff30 =
           Qt::Literals::StringLiterals::operator____L1(in_RDI,(size_t)in_stack_ffffffffffffff20);
      QString::operator+=((QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff30);
    }
    local_58 = local_30.m_size;
    local_50 = local_30.m_data;
    QString::operator+=((QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        in_stack_ffffffffffffff30);
    QString::toHtmlEscaped();
    QString::operator+=((QString *)in_stack_ffffffffffffff20,
                        (QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QString::~QString((QString *)0x7b1476);
    local_80 = local_30.m_size;
    local_78 = local_30.m_data;
    QString::operator+=((QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        in_stack_ffffffffffffff30);
    QList<QString>::const_iterator::operator++(&local_10);
  }
  QChar::QChar<char16_t,_true>(&local_82,L';');
  QString::operator+=((QString *)in_stack_ffffffffffffff20,(QChar)(char16_t)((ulong)in_RDI >> 0x30))
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlExporter::emitFontFamily(const QStringList &families)
{
    html += " font-family:"_L1;

    bool first = true;
    for (const QString &family : families) {
        auto quote = "\'"_L1;
        if (family.contains(u'\''))
            quote = "&quot;"_L1;

        if (!first)
            html += ","_L1;
        else
            first = false;
        html += quote;
        html += family.toHtmlEscaped();
        html += quote;
    }
    html += u';';
}